

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

iterator __thiscall
boost::unordered::detail::foa::
table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
::begin(table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
        *this)

{
  uint uVar1;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  *this_00;
  value_type *pvVar2;
  group_type *in_RDI;
  iterator it;
  table_element_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_10 [16];
  
  this_00 = (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             *)table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
               ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
                         *)0x92b2b8);
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
              *)0x92b2c7);
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  ::table_iterator(this_00,in_RDI,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  pvVar2 = table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
           ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
                       *)0x92b2e9);
  if (pvVar2 != (value_type *)0x0) {
    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
    ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
              *)0x92b2f9);
    uVar1 = group15<boost::unordered::detail::foa::plain_integral>::match_occupied
                      ((group15<boost::unordered::detail::foa::plain_integral> *)0x92b301);
    if ((uVar1 & 1) == 0) {
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)CONCAT44(uVar1,in_stack_ffffffffffffffd0));
    }
  }
  return (iterator)local_10;
}

Assistant:

iterator begin() noexcept {
        iterator it{this->arrays.groups(), 0, this->arrays.elements()};
        if (this->arrays.elements() && !(this->arrays.groups()[0].match_occupied() & 0x1))
            ++it;
        return it;
    }